

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::anon_unknown_0::BasicResourceUBO::RunIteration
          (BasicResourceUBO *this,uvec3 *param_1,uvec3 *num_groups,bool dispatch_indirect)

{
  CallLogWrapper *this_00;
  GLuint *buffers;
  undefined8 *puVar1;
  bool bVar2;
  GLuint GVar3;
  uint uVar4;
  uint uVar5;
  ostream *poVar6;
  bool *compile_error;
  GLuint i;
  long lVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  GLuint z;
  uint uVar11;
  bool bVar12;
  uvec3 global_size;
  GLint p;
  undefined4 uStack_204;
  size_type sStack_200;
  Vector<float,_4> local_1e8;
  Vector<float,_4> local_1d8;
  long local_1c8;
  size_type local_1c0;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  
  if (this->m_program != 0) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
  }
  tcu::operator*((tcu *)&global_size,param_1,num_groups);
  std::__cxx11::stringstream::stringstream((stringstream *)&data);
  poVar6 = std::operator<<((ostream *)
                           &data.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           "\nlayout(local_size_x = ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6,", local_size_y = ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6,", local_size_z = ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6,") in;\nconst uvec3 kGlobalSize = uvec3(");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6,", ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6,", ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6,");\nlayout(std140) uniform InputBuffer {\n  vec4 data[");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6,
                           "];\n} g_in_buffer[12];\nlayout(std430) buffer OutputBuffer {\n  vec4 data0["
                          );
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6,"];\n  vec4 data1[");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6,"];\n  vec4 data2[");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6,"];\n  vec4 data3[");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6,"];\n  vec4 data4[");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6,"];\n  vec4 data5[");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6,"];\n  vec4 data6[");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6,"];\n  vec4 data7[");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6,"];\n  vec4 data8[");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6,"];\n  vec4 data9[");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6,"];\n  vec4 data10[");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6,"];\n  vec4 data11[");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::operator<<(poVar6,
                  "];\n} g_out_buffer;\nvoid main() {\n  const uint global_index = gl_GlobalInvocationID.x +\n                            gl_GlobalInvocationID.y * kGlobalSize.x +\n                            gl_GlobalInvocationID.z * kGlobalSize.x * kGlobalSize.y;\n  g_out_buffer.data0[global_index] = g_in_buffer[0].data[global_index];\n  g_out_buffer.data1[global_index] = g_in_buffer[1].data[global_index];\n  g_out_buffer.data2[global_index] = g_in_buffer[2].data[global_index];\n  g_out_buffer.data3[global_index] = g_in_buffer[3].data[global_index];\n  g_out_buffer.data4[global_index] = g_in_buffer[4].data[global_index];\n  g_out_buffer.data5[global_index] = g_in_buffer[5].data[global_index];\n  g_out_buffer.data6[global_index] = g_in_buffer[6].data[global_index];\n  g_out_buffer.data7[global_index] = g_in_buffer[7].data[global_index];\n  g_out_buffer.data8[global_index] = g_in_buffer[8].data[global_index];\n  g_out_buffer.data9[global_index] = g_in_buffer[9].data[global_index];\n  g_out_buffer.data10[global_index] = g_in_buffer[10].data[global_index];\n  g_out_buffer.data11[global_index] = g_in_buffer[11].data[global_index];\n}"
                 );
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&data);
  GVar3 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,(string *)&p);
  this->m_program = GVar3;
  std::__cxx11::string::~string((string *)&p);
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
  bVar2 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  bVar12 = false;
  if (bVar2) {
    for (uVar8 = 0; uVar8 != 0xc; uVar8 = uVar8 + 1) {
      sprintf((char *)&data,"InputBuffer[%u]",(ulong)uVar8);
      GVar3 = glu::CallLogWrapper::glGetUniformBlockIndex(this_00,this->m_program,(GLchar *)&data);
      glu::CallLogWrapper::glUniformBlockBinding(this_00,this->m_program,GVar3,uVar8);
      p = 0;
      glu::CallLogWrapper::glGetActiveUniformBlockiv(this_00,this->m_program,GVar3,0x90ec,&p);
      if (p == 0) {
        anon_unknown_0::Output("UNIFORM_BLOCK_REFERENCED_BY_COMPUTE_SHADER should be TRUE.\n");
        return false;
      }
    }
    uVar8 = num_groups->m_data[0] * param_1->m_data[0] * param_1->m_data[1] * num_groups->m_data[1]
            * param_1->m_data[2] * num_groups->m_data[2];
    buffers = &this->m_storage_buffer;
    GVar3 = this->m_storage_buffer;
    if (GVar3 == 0) {
      glu::CallLogWrapper::glGenBuffers(this_00,1,buffers);
      GVar3 = *buffers;
    }
    uVar4 = 0;
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,GVar3);
    uVar10 = (ulong)uVar8;
    local_1c8 = uVar10 * 0xc0;
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,local_1c8,(void *)0x0,0x88e8);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
    if (this->m_uniform_buffer[0] == 0) {
      glu::CallLogWrapper::glGenBuffers(this_00,0xc,this->m_uniform_buffer);
    }
    local_1c0 = uVar10;
    for (lVar7 = 0; lVar7 != 0xc; lVar7 = lVar7 + 1) {
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                (&data,local_1c0,(allocator_type *)&p);
      uVar11 = uVar4;
      for (lVar9 = 0; uVar10 << 4 != lVar9; lVar9 = lVar9 + 0x10) {
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&p,(float)uVar11);
        puVar1 = (undefined8 *)
                 ((long)(data.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar9);
        *puVar1 = CONCAT44(uStack_204,p);
        puVar1[1] = sStack_200;
        uVar11 = uVar11 + 1;
      }
      glu::CallLogWrapper::glBindBufferBase
                (this_00,0x8a11,(GLuint)lVar7,this->m_uniform_buffer[lVar7]);
      glu::CallLogWrapper::glBufferData
                (this_00,0x8a11,uVar10 << 4,
                 data.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start,0x88e8);
      std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
      ~_Vector_base(&data.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   );
      uVar4 = uVar4 + uVar8;
    }
    glu::CallLogWrapper::glBindBuffer(this_00,0x8a11,0);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    if (dispatch_indirect) {
      GVar3 = this->m_dispatch_buffer;
      if (GVar3 == 0) {
        glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_dispatch_buffer);
        GVar3 = this->m_dispatch_buffer;
      }
      glu::CallLogWrapper::glBindBuffer(this_00,0x90ee,GVar3);
      glu::CallLogWrapper::glBufferData(this_00,0x90ee,0xc,num_groups,0x88e4);
      glu::CallLogWrapper::glDispatchComputeIndirect(this_00,0);
    }
    else {
      glu::CallLogWrapper::glDispatchCompute
                (this_00,num_groups->m_data[0],num_groups->m_data[1],num_groups->m_data[2]);
    }
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&data,(ulong)(uVar8 * 0xc),(allocator_type *)&p);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,*buffers);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    glu::CallLogWrapper::glGetBufferSubData
              (this_00,0x90d2,0,local_1c8,
               data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    for (uVar8 = 0; bVar12 = num_groups->m_data[2] * param_1->m_data[2] <= uVar8, !bVar12;
        uVar8 = uVar8 + 1) {
      for (uVar4 = 0; uVar4 < num_groups->m_data[1] * param_1->m_data[1]; uVar4 = uVar4 + 1) {
        uVar11 = 0;
        while (uVar5 = param_1->m_data[0] * num_groups->m_data[0], uVar11 < uVar5) {
          uVar5 = (uVar5 * (param_1->m_data[1] * uVar8 * num_groups->m_data[1] + uVar4) + uVar11) *
                  0xc;
          tcu::Vector<float,_4>::Vector
                    (&local_1d8,
                     data.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar5);
          tcu::Vector<float,_4>::Vector(&local_1e8,(float)uVar5);
          if ((local_1d8.m_data[0] != local_1e8.m_data[0]) ||
             (NAN(local_1d8.m_data[0]) || NAN(local_1e8.m_data[0]))) goto LAB_009c4695;
          if ((local_1d8.m_data[1] != local_1e8.m_data[1]) ||
             (NAN(local_1d8.m_data[1]) || NAN(local_1e8.m_data[1]))) goto LAB_009c4695;
          if ((local_1d8.m_data[2] != local_1e8.m_data[2]) ||
             (NAN(local_1d8.m_data[2]) || NAN(local_1e8.m_data[2]))) goto LAB_009c4695;
          uVar11 = uVar11 + 1;
          if ((local_1d8.m_data[3] != local_1e8.m_data[3]) ||
             (NAN(local_1d8.m_data[3]) || NAN(local_1e8.m_data[3]))) {
LAB_009c4695:
            anon_unknown_0::Output("Incorrect data at offset %d.\n",(ulong)uVar5);
            goto LAB_009c46a5;
          }
        }
      }
    }
LAB_009c46a5:
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              (&data.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  }
  return bVar12;
}

Assistant:

bool RunIteration(const uvec3& local_size, const uvec3& num_groups, bool dispatch_indirect)
	{
		if (m_program != 0)
			glDeleteProgram(m_program);
		m_program = CreateComputeProgram(GenSource(local_size, num_groups));
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return false;

		for (GLuint i = 0; i < 12; ++i)
		{
			char name[32];
			sprintf(name, "InputBuffer[%u]", i);
			const GLuint index = glGetUniformBlockIndex(m_program, name);
			glUniformBlockBinding(m_program, index, i);
			GLint p = 0;
			glGetActiveUniformBlockiv(m_program, index, GL_UNIFORM_BLOCK_REFERENCED_BY_COMPUTE_SHADER, &p);
			if (p == GL_FALSE)
			{
				Output("UNIFORM_BLOCK_REFERENCED_BY_COMPUTE_SHADER should be TRUE.\n");
				return false;
			}
		}

		const GLuint kBufferSize =
			local_size.x() * num_groups.x() * local_size.y() * num_groups.y() * local_size.z() * num_groups.z();

		if (m_storage_buffer == 0)
			glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(vec4) * kBufferSize * 12, NULL, GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		if (m_uniform_buffer[0] == 0)
			glGenBuffers(12, m_uniform_buffer);
		for (GLuint i = 0; i < 12; ++i)
		{
			std::vector<vec4> data(kBufferSize);
			for (GLuint j = 0; j < kBufferSize; ++j)
			{
				data[j] = vec4(static_cast<float>(i * kBufferSize + j));
			}
			glBindBufferBase(GL_UNIFORM_BUFFER, i, m_uniform_buffer[i]);
			glBufferData(GL_UNIFORM_BUFFER, sizeof(vec4) * kBufferSize, &data[0], GL_DYNAMIC_DRAW);
		}
		glBindBuffer(GL_UNIFORM_BUFFER, 0);

		glUseProgram(m_program);
		if (dispatch_indirect)
		{
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(num_groups), &num_groups[0], GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(num_groups.x(), num_groups.y(), num_groups.z());
		}

		std::vector<vec4> data(kBufferSize * 12);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(vec4) * kBufferSize * 12, &data[0]);

		for (GLuint z = 0; z < local_size.z() * num_groups.z(); ++z)
		{
			for (GLuint y = 0; y < local_size.y() * num_groups.y(); ++y)
			{
				for (GLuint x = 0; x < local_size.x() * num_groups.x(); ++x)
				{
					const GLuint index = z * local_size.x() * num_groups.x() * local_size.y() * num_groups.y() +
										 y * local_size.x() * num_groups.x() + x;
					for (int i = 0; i < 1; ++i)
					{
						if (!IsEqual(data[index * 12 + i], vec4(static_cast<float>(index * 12 + i))))
						{
							Output("Incorrect data at offset %d.\n", index * 12 + i);
							return false;
						}
					}
				}
			}
		}
		return true;
	}